

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_read_attributes_uint16(void *a,uint16_t **attrib)

{
  uint8_t *__ptr;
  uint32_t uVar1;
  ssize_t sVar2;
  char *pcVar3;
  uint8_t *b2;
  int iVar4;
  int iVar5;
  ulong __size;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_attribs;
  uint8_t *local_38;
  
  iVar5 = 0;
  if (*(int *)((long)a + 0x24) == 0x12) {
    sVar2 = read((int)&nr_of_attribs,(void *)0x4,1);
    if ((int)sVar2 == 0) {
      iVar5 = 0;
    }
    else {
      sVar2 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
      uVar1 = nr_of_compressed_bytes;
      iVar4 = 0;
      iVar5 = 0;
      if ((int)sVar2 != 0) {
        __size = (ulong)nr_of_compressed_bytes;
        pcVar3 = (char *)malloc(__size);
        sVar2 = read((int)pcVar3,(void *)0x1,__size);
        iVar5 = iVar4;
        if ((int)sVar2 != 0) {
          local_38 = (uint8_t *)malloc((ulong)nr_of_attribs);
          uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_38,uVar1,nr_of_attribs);
          if (uVar1 != nr_of_attribs) {
            __assert_fail("bytes_decompressed == nr_of_attribs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x5bd,"int trico_read_attributes_uint16(void *, uint16_t **)");
          }
          sVar2 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
          if ((int)sVar2 != 0) {
            pcVar3 = (char *)realloc(pcVar3,(ulong)nr_of_compressed_bytes);
            sVar2 = read((int)pcVar3,(void *)0x1,(ulong)nr_of_compressed_bytes);
            if ((int)sVar2 != 0) {
              b2 = (uint8_t *)malloc((ulong)nr_of_attribs);
              uVar1 = LZ4_decompress_safe(pcVar3,(char *)b2,nr_of_compressed_bytes,nr_of_attribs);
              __ptr = local_38;
              if (uVar1 != nr_of_attribs) {
                __assert_fail("bytes_decompressed == nr_of_attribs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x5c6,"int trico_read_attributes_uint16(void *, uint16_t **)");
              }
              if (attrib != (uint16_t **)0x0) {
                trico_transpose_uint16_soa_to_aos(attrib,local_38,b2,nr_of_attribs);
              }
              free(pcVar3);
              free(__ptr);
              free(b2);
              read_next_stream_type((trico_archive *)a);
              iVar5 = 1;
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int trico_read_attributes_uint16(void* a, uint16_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_uint16_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (attrib != NULL)
    trico_transpose_uint16_soa_to_aos(attrib, decompressed_b1, decompressed_b2, nr_of_attribs);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);

  read_next_stream_type(arch);

  return 1;
  }